

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilProgress.c
# Opt level: O3

void Extra_ProgressBarUpdate_int(ProgressBar *p,int nItemsCur,char *pString)

{
  int iVar1;
  
  if ((p != (ProgressBar *)0x0) && (p->nItemsNext <= nItemsCur)) {
    if (nItemsCur < p->nItemsTotal) {
      iVar1 = p->posCur + 7;
      p->posCur = iVar1;
      iVar1 = (int)(((double)p->nItemsTotal * ((double)iVar1 + 7.0)) / (double)p->posTotal);
    }
    else {
      p->posCur = 0x4e;
      iVar1 = 0x7fffffff;
    }
    p->nItemsNext = iVar1;
    Extra_ProgressBarShow(p,pString);
    return;
  }
  return;
}

Assistant:

void Extra_ProgressBarUpdate_int( ProgressBar * p, int nItemsCur, char * pString )
{
    if ( p == NULL ) return;
    if ( nItemsCur < p->nItemsNext )
        return;
    if ( nItemsCur >= p->nItemsTotal )
    {
        p->posCur = 78;
        p->nItemsNext = 0x7FFFFFFF;
    }
    else
    {
        p->posCur += 7;
        p->nItemsNext = (int)((7.0+p->posCur)*p->nItemsTotal/p->posTotal);
    }
    Extra_ProgressBarShow( p, pString );
}